

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O0

int roulette(int *p1,int *p2)

{
  double dVar1;
  double *__ptr;
  long lVar2;
  int local_34;
  int i;
  double spin;
  double *wheel;
  int *p2_local;
  int *p1_local;
  
  __ptr = (double *)malloc((long)popsize << 3);
  if (__ptr == (double *)0x0) {
    p1_local._4_4_ = 0;
  }
  else {
    *__ptr = 1.0 / (double)storedd[numvars];
    for (local_34 = 1; local_34 < popsize; local_34 = local_34 + 1) {
      __ptr[local_34] =
           __ptr[local_34 + -1] + 1.0 / (double)storedd[local_34 * (numvars + 1) + numvars];
    }
    dVar1 = __ptr[numvars + -1];
    lVar2 = Cudd_Random();
    for (local_34 = 0;
        (local_34 < popsize && (__ptr[local_34] < (dVar1 * (double)lVar2) / 2147483561.0));
        local_34 = local_34 + 1) {
    }
    *p1 = local_34;
    do {
      dVar1 = __ptr[popsize + -1];
      lVar2 = Cudd_Random();
      for (local_34 = 0;
          (local_34 < popsize && (__ptr[local_34] < (dVar1 * (double)lVar2) / 2147483561.0));
          local_34 = local_34 + 1) {
      }
    } while (local_34 == *p1);
    *p2 = local_34;
    if (__ptr != (double *)0x0) {
      free(__ptr);
    }
    p1_local._4_4_ = 1;
  }
  return p1_local._4_4_;
}

Assistant:

static int
roulette(
  int * p1,
  int * p2)
{
    double *wheel;
    double spin;
    int i;

    wheel = ABC_ALLOC(double,popsize);
    if (wheel == NULL) {
        return(0);
    }

    /* The fitness of an individual is the reciprocal of its size. */
    wheel[0] = 1.0 / (double) STOREDD(0,numvars);

    for (i = 1; i < popsize; i++) {
        wheel[i] = wheel[i-1] + 1.0 / (double) STOREDD(i,numvars);
    }

    /* Get a random number between 0 and wheel[popsize-1] (that is,
    ** the sum of all fitness values. 2147483561 is the largest number
    ** returned by Cudd_Random.
    */
    spin = wheel[numvars-1] * (double) Cudd_Random() / 2147483561.0;

    /* Find the lucky element by scanning the wheel. */
    for (i = 0; i < popsize; i++) {
        if (spin <= wheel[i]) break;
    }
    *p1 = i;

    /* Repeat the process for the second parent, making sure it is
    ** distinct from the first.
    */
    do {
        spin = wheel[popsize-1] * (double) Cudd_Random() / 2147483561.0;
        for (i = 0; i < popsize; i++) {
            if (spin <= wheel[i]) break;
        }
    } while (i == *p1);
    *p2 = i;

    ABC_FREE(wheel);
    return(1);

}